

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

MacroActualArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentSyntax,slang::syntax::TokenList_const&>
          (BumpAllocator *this,TokenList *args)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  MacroActualArgumentSyntax *pMVar4;
  
  pMVar4 = (MacroActualArgumentSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroActualArgumentSyntax *)this->endPtr < pMVar4 + 1) {
    pMVar4 = (MacroActualArgumentSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pMVar4 + 1);
  }
  (pMVar4->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar4->super_SyntaxNode).kind = MacroActualArgument;
  SVar2 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (pMVar4->tokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pMVar4->tokens).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  sVar1 = (args->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
  (pMVar4->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
       (args->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
  (pMVar4->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar1;
  (pMVar4->tokens).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004e9e50;
  (pMVar4->tokens).super_SyntaxListBase.super_SyntaxNode.parent = &pMVar4->super_SyntaxNode;
  return pMVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }